

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O1

bool __thiscall CaDiCaL::Internal::disconnect_proof_tracer(Internal *this,Tracer *tracer)

{
  Tracer **__src;
  pointer *pppTVar1;
  Tracer **ppTVar2;
  __normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
  __dest;
  
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<CaDiCaL::Tracer**,std::vector<CaDiCaL::Tracer*,std::allocator<CaDiCaL::Tracer*>>>,__gnu_cxx::__ops::_Iter_equals_val<CaDiCaL::Tracer*const>>
                     ((this->tracers).
                      super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (this->tracers).
                      super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  ppTVar2 = (this->tracers).
            super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (__dest._M_current != ppTVar2) {
    __src = __dest._M_current + 1;
    if (__src != ppTVar2) {
      memmove(__dest._M_current,__src,(long)ppTVar2 - (long)__src);
    }
    pppTVar1 = &(this->tracers).
                super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + -1;
    Proof::disconnect(this->proof,tracer);
  }
  return __dest._M_current != ppTVar2;
}

Assistant:

bool Internal::disconnect_proof_tracer (Tracer *tracer) {
  auto it = std::find (tracers.begin (), tracers.end (), tracer);
  if (it != tracers.end ()) {
    tracers.erase (it);
    assert (proof);
    proof->disconnect (tracer);
    return true;
  }
  return false;
}